

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNext_None(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int nKeep_00;
  Fts5SegIter *in_RDX;
  Fts5Index *in_RSI;
  u8 **in_RDI;
  long in_FS_OFFSET;
  int iOff;
  int nList;
  int nTerm;
  char *zTerm;
  u8 *pList;
  int nKeep;
  u64 iDelta;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 uVar6;
  char **pzTerm;
  Fts5Hash *pHash;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (int)*(undefined8 *)&in_RSI->nPendingData;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffb0 & 0xffffff;
    if (in_RSI->pConfig != (Fts5Config *)0x0) {
      uVar1 = CONCAT13(*(int *)(*(long *)&in_RSI->nWorkUnit + 0xc) <= iVar4,
                       (int3)in_stack_ffffffffffffffb0);
    }
    in_stack_ffffffffffffffb0 = uVar1;
    if ((char)(in_stack_ffffffffffffffb0 >> 0x18) == '\0') break;
    fts5SegIterNextPage(in_RSI,in_RDX);
    if ((*(int *)((long)in_RDI + 0x3c) != 0) || (*(long *)&in_RSI->nWorkUnit == 0))
    goto LAB_0027e1de;
    in_RSI->pIdxSelect = (sqlite3_stmt *)0x0;
    iVar4 = 4;
  }
  if (iVar4 < *(int *)&in_RSI->field_0x44) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    bVar2 = sqlite3Fts5GetVarint
                      ((uchar *)(**(long **)&in_RSI->nWorkUnit + (long)iVar4),(u64 *)&local_10);
    *(long *)&in_RSI->nPendingData = (long)(int)((uint)bVar2 + iVar4);
    in_RSI->pIdxSelect = in_RSI->pIdxSelect + (long)local_10;
  }
  else {
    if (((ulong)in_RSI->zDataTbl & 1) != 0) {
LAB_0027e1c3:
      fts5DataRelease((Fts5Data *)0x27e1d1);
      *(undefined8 *)&in_RSI->nWorkUnit = 0;
      goto LAB_0027e1de;
    }
    if (in_RSI->pConfig == (Fts5Config *)0x0) {
      pHash = (Fts5Hash *)0x0;
      pzTerm = (char **)0x0;
      uVar6 = 0;
      uVar5 = 0xaaaaaaaa;
      sqlite3Fts5HashScanNext((Fts5Hash *)in_RDI[3]);
      sqlite3Fts5HashScanEntry(pHash,pzTerm,(int *)CONCAT44(uVar6,uVar5),in_RDI,(int *)in_RSI);
      if (pHash == (Fts5Hash *)0x0) goto LAB_0027e1c3;
      **(undefined8 **)&in_RSI->nWorkUnit = pHash;
      *(undefined4 *)(*(long *)&in_RSI->nWorkUnit + 8) = uVar5;
      *(undefined4 *)(*(long *)&in_RSI->nWorkUnit + 0xc) = uVar5;
      *(undefined4 *)&in_RSI->field_0x44 = uVar5;
      sqlite3Fts5BufferSet
                ((int *)in_RSI,(Fts5Buffer *)in_RDX,iVar4,
                 (u8 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      bVar2 = sqlite3Fts5GetVarint((uchar *)pHash,(u64 *)&in_RSI->pIdxSelect);
      *(ulong *)&in_RSI->nPendingData = (ulong)bVar2;
    }
    else {
      nKeep_00 = iVar4;
      iVar3 = fts5LeafFirstTermOff((Fts5Data *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
      if (iVar4 != iVar3) {
        iVar4 = sqlite3Fts5GetVarint32
                          ((uchar *)in_RDX,(u32 *)CONCAT44(nKeep_00,in_stack_ffffffffffffffb0));
        nKeep_00 = iVar4 + nKeep_00;
      }
      *(long *)&in_RSI->nPendingData = (long)nKeep_00;
      fts5SegIterLoadTerm(in_RSI,in_RDX,nKeep_00);
    }
    if (in_RDX != (Fts5SegIter *)0x0) {
      *(undefined4 *)&in_RDX->pSeg = 1;
    }
  }
  fts5SegIterLoadNPos(in_RSI,in_RDX);
LAB_0027e1de:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5SegIterNext_None(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  int iOff;

  assert( p->rc==SQLITE_OK );
  assert( (pIter->flags & FTS5_SEGITER_REVERSE)==0 );
  assert( p->pConfig->eDetail==FTS5_DETAIL_NONE );

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  iOff = pIter->iLeafOffset;

  /* Next entry is on the next page */
  while( pIter->pSeg && iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( p->rc || pIter->pLeaf==0 ) return;
    pIter->iRowid = 0;
    iOff = 4;
  }

  if( iOff<pIter->iEndofDoclist ){
    /* Next entry is on the current page */
    u64 iDelta;
    iOff += sqlite3Fts5GetVarint(&pIter->pLeaf->p[iOff], (u64*)&iDelta);
    pIter->iLeafOffset = iOff;
    pIter->iRowid += iDelta;
  }else if( (pIter->flags & FTS5_SEGITER_ONETERM)==0 ){
    if( pIter->pSeg ){
      int nKeep = 0;
      if( iOff!=fts5LeafFirstTermOff(pIter->pLeaf) ){
        iOff += fts5GetVarint32(&pIter->pLeaf->p[iOff], nKeep);
      }
      pIter->iLeafOffset = iOff;
      fts5SegIterLoadTerm(p, pIter, nKeep);
    }else{
      const u8 *pList = 0;
      const char *zTerm = 0;
      int nTerm = 0;
      int nList;
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &nTerm, &pList, &nList);
      if( pList==0 ) goto next_none_eof;
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term, nTerm, (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
    }

    if( pbNewTerm ) *pbNewTerm = 1;
  }else{
    goto next_none_eof;
  }

  fts5SegIterLoadNPos(p, pIter);

  return;
 next_none_eof:
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
}